

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shake.cpp
# Opt level: O0

int __thiscall OpenMD::Shake::constraintPairF(Shake *this,ConstraintPair *consPair)

{
  bool bVar1;
  ConstraintPair *in_RSI;
  Vector<double,_3U> *in_RDI;
  RealType RVar2;
  RealType RVar3;
  double dVar4;
  double dVar5;
  ConstraintElem *this_00;
  double dVar6;
  RealType rfab;
  RealType rabsq;
  RealType gab;
  Vector3d fpab;
  RealType rmb;
  RealType rma;
  Vector3d frcB;
  Vector3d frcA;
  Vector3d rab;
  Vector3d posB;
  Vector3d posA;
  ConstraintElem *consElem2;
  ConstraintElem *consElem1;
  ConstraintElem *in_stack_fffffffffffffe78;
  Vector<double,_3U> *in_stack_fffffffffffffe80;
  Vector<double,_3U> *in_stack_fffffffffffffe90;
  double local_130;
  Vector3d *in_stack_fffffffffffffef8;
  Snapshot *in_stack_ffffffffffffff00;
  uint local_4;
  
  ConstraintPair::getConsElem1(in_RSI);
  ConstraintPair::getConsElem2(in_RSI);
  ConstraintElem::getPos(in_stack_fffffffffffffe78);
  ConstraintElem::getPos(in_stack_fffffffffffffe78);
  OpenMD::operator-(in_RDI,in_stack_fffffffffffffe80);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffe80,
             (Vector<double,_3U> *)in_stack_fffffffffffffe78);
  Snapshot::wrapVector(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  ConstraintElem::getFrc(in_stack_fffffffffffffe78);
  ConstraintElem::getFrc(in_stack_fffffffffffffe78);
  RVar2 = ConstraintElem::getMass((ConstraintElem *)0x18e9f7);
  RVar3 = ConstraintElem::getMass((ConstraintElem *)0x18ea1c);
  OpenMD::operator*(in_RDI,(double)in_stack_fffffffffffffe80);
  OpenMD::operator*(in_RDI,(double)in_stack_fffffffffffffe80);
  OpenMD::operator-(in_RDI,in_stack_fffffffffffffe80);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffe80,
             (Vector<double,_3U> *)in_stack_fffffffffffffe78);
  local_130 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x18eaa3);
  if (local_130 < 1.0) {
    local_130 = 1.0;
  }
  dVar4 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x18ead4);
  dVar5 = dot<double,3u>(in_stack_fffffffffffffe90,in_RDI);
  this_00 = (ConstraintElem *)((ulong)dVar5 & 0x7fffffffffffffff);
  dVar6 = sqrt(dVar4 * local_130);
  bVar1 = (double)this_00 <= dVar6 * in_RDI->data_[2];
  if (!bVar1) {
    OpenMD::operator*(in_RDI,(double)this_00);
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)this_00,(Vector<double,_3U> *)in_stack_fffffffffffffe78);
    OpenMD::operator*(in_RDI,(double)this_00);
    Vector<double,_3U>::operator-=
              ((Vector<double,_3U> *)this_00,(Vector<double,_3U> *)in_stack_fffffffffffffe78);
    ConstraintElem::setFrc(this_00,(Vector3d *)in_stack_fffffffffffffe78);
    ConstraintElem::setFrc(this_00,(Vector3d *)in_stack_fffffffffffffe78);
    ConstraintPair::setConstraintForce(in_RSI,-dVar5 / (dVar4 * (1.0 / RVar2 + 1.0 / RVar3)));
  }
  local_4 = (uint)bVar1;
  return local_4;
}

Assistant:

int Shake::constraintPairF(ConstraintPair* consPair) {
    ConstraintElem* consElem1 = consPair->getConsElem1();
    ConstraintElem* consElem2 = consPair->getConsElem2();

    Vector3d posA = consElem1->getPos();
    Vector3d posB = consElem2->getPos();

    Vector3d rab = posA - posB;

    currentSnapshot_->wrapVector(rab);

    Vector3d frcA = consElem1->getFrc();
    Vector3d frcB = consElem2->getFrc();

    RealType rma = 1.0 / consElem1->getMass();
    RealType rmb = 1.0 / consElem2->getMass();

    Vector3d fpab = frcA * rma - frcB * rmb;

    RealType gab = fpab.lengthSquare();
    if (gab < 1.0) gab = 1.0;

    RealType rabsq = rab.lengthSquare();
    RealType rfab  = dot(rab, fpab);

    if (fabs(rfab) > sqrt(rabsq * gab) * consTolerance_) {
      gab = -rfab / (rabsq * (rma + rmb));

      frcA += rab * gab;
      frcB -= rab * gab;

      consElem1->setFrc(frcA);
      consElem2->setFrc(frcB);

      // report the constraint force back to the constraint pair:
      consPair->setConstraintForce(gab);
      return consSuccess;
    } else
      return consAlready;
  }